

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

object * slot_object(player *p,wchar_t slot)

{
  wchar_t slot_local;
  player *p_local;
  
  if ((L'\xffffffff' < slot) && (slot < (int)(uint)(p->body).count)) {
    if (((p->body).slots == (equip_slot *)0x0) || ((p->body).slots[slot].obj == (object *)0x0)) {
      p_local = (player *)0x0;
    }
    else {
      p_local = (player *)(p->body).slots[slot].obj;
    }
    return (object *)p_local;
  }
  __assert_fail("slot >= 0 && slot < p->body.count",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                ,0x76,"struct object *slot_object(struct player *, int)");
}

Assistant:

struct object *slot_object(struct player *p, int slot)
{
	/* Check bounds */
	assert(slot >= 0 && slot < p->body.count);

	/* Ensure a valid body */
	if (p->body.slots && p->body.slots[slot].obj) {
		return p->body.slots[slot].obj;
	}

	return NULL;
}